

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui_rect.cpp
# Opt level: O1

void __thiscall CUIRect::HSplitMid(CUIRect *this,CUIRect *pTop,CUIRect *pBottom,float Spacing)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  float fVar5;
  float fVar6;
  
  uVar3 = this->x;
  uVar4 = this->y;
  fVar1 = this->w;
  fVar2 = this->h;
  fVar6 = fVar2 * 0.5;
  fVar5 = Spacing * 0.5;
  if (pTop != (CUIRect *)0x0) {
    pTop->x = (float)uVar3;
    pTop->y = (float)uVar4;
    pTop->w = fVar1;
    pTop->h = fVar6 - fVar5;
  }
  if (pBottom != (CUIRect *)0x0) {
    pBottom->x = (float)uVar3;
    pBottom->y = (float)uVar4 + fVar6 + fVar5;
    pBottom->w = fVar1;
    pBottom->h = (fVar2 - fVar6) - fVar5;
  }
  return;
}

Assistant:

void CUIRect::HSplitMid(CUIRect *pTop, CUIRect *pBottom, float Spacing) const
{
	CUIRect r = *this;
	const float Cut = r.h/2;
	const float HalfSpacing = Spacing/2;

	if(pTop)
	{
		pTop->x = r.x;
		pTop->y = r.y;
		pTop->w = r.w;
		pTop->h = Cut - HalfSpacing;
	}

	if(pBottom)
	{
		pBottom->x = r.x;
		pBottom->y = r.y + Cut + HalfSpacing;
		pBottom->w = r.w;
		pBottom->h = r.h - Cut - HalfSpacing;
	}
}